

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O3

bool __thiscall QtMWidgets::SwitchPrivate::isChecked(SwitchPrivate *this)

{
  return (this->state & ~AcceptedUncheck) == NotAcceptedCheck;
}

Assistant:

bool
SwitchPrivate::isChecked() const
{
	switch( state )
	{
		case Switch::NotAcceptedUncheck :
		case Switch::AcceptedUncheck :
			return false;

		case Switch::NotAcceptedCheck :
		case Switch::AcceptedCheck :
			return true;

		default :
			return false;
	}
}